

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

int Lodtalk::Behavior::stRegisterInClassTable(InterpreterProxy *interpreter)

{
  int iVar1;
  undefined4 extraout_var;
  Oop clazz;
  undefined4 extraout_var_01;
  _func_int **pp_Var2;
  undefined4 extraout_var_00;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    clazz.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    clazz.field_0.uintValue._4_4_ = extraout_var_00;
    iVar1 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
    VMContext::registerClassInTable((VMContext *)CONCAT44(extraout_var_01,iVar1),clazz);
    pp_Var2 = interpreter->_vptr_InterpreterProxy + 0x12;
  }
  else {
    pp_Var2 = interpreter->_vptr_InterpreterProxy + 0x1e;
  }
  iVar1 = (**pp_Var2)(interpreter);
  return iVar1;
}

Assistant:

int Behavior::stRegisterInClassTable(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto selfOop = interpreter->getReceiver();
    interpreter->getContext()->registerClassInTable(selfOop);
    return interpreter->returnReceiver();
}